

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O1

int kyber_marshal_public_key(CBB *out,public_key *pub)

{
  int iVar1;
  uint uVar2;
  uint8_t *in_RAX;
  long lVar3;
  uint8_t *out_00;
  uint8_t *vector_output;
  uint8_t *local_28;
  
  local_28 = in_RAX;
  iVar1 = CBB_add_space(out,&local_28,0x480);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    lVar3 = 0;
    out_00 = local_28;
    do {
      scalar_encode(out_00,(scalar *)((long)(pub->t).v[0].c + lVar3),0xc);
      out_00 = out_00 + 0x180;
      lVar3 = lVar3 + 0x200;
    } while (lVar3 != 0x600);
    iVar1 = CBB_add_bytes(out,pub->rho,0x20);
    uVar2 = (uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

static int kyber_marshal_public_key(CBB *out, const struct public_key *pub) {
  uint8_t *vector_output;
  if (!CBB_add_space(out, &vector_output, kEncodedVectorSize)) {
    return 0;
  }
  vector_encode(vector_output, &pub->t, kLog2Prime);
  if (!CBB_add_bytes(out, pub->rho, sizeof(pub->rho))) {
    return 0;
  }
  return 1;
}